

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_> *node)

{
  pointer pAVar1;
  unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_> *in_RDX;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  local_40;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  local_30;
  unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pAVar1 = std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>::
           operator->(in_RDX);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  ::variant(&local_40,&pAVar1->value);
  visit<std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Attribute,std::default_delete<verilogAST::Attribute>>>>
            (&local_30,(Transformer *)node,&local_40);
  pAVar1 = std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>::
           operator->(in_RDX);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  ::operator=(&pAVar1->value,&local_30);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  ::~variant(&local_30);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
  ::~variant(&local_40);
  std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>::unique_ptr
            ((unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_> *)this,
             in_RDX);
  return (__uniq_ptr_data<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>,_true,_true>
          )(__uniq_ptr_data<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Attribute> Transformer::visit(std::unique_ptr<Attribute> node) {
  node->value = this->visit(std::move(node->value));
  return node;
}